

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
          (TiledRgbaInputFile *this,IStream *is,string *layerName,int numThreads)

{
  RgbaChannels RVar1;
  void *pvVar2;
  undefined4 in_ECX;
  undefined8 *in_RDI;
  int in_stack_000001b4;
  IStream *in_stack_000001b8;
  TiledInputFile *in_stack_000001c0;
  TiledRgbaInputFile *this_00;
  Header *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  *in_RDI = &PTR__TiledRgbaInputFile_005627b0;
  pvVar2 = operator_new(0x10);
  TiledInputFile::TiledInputFile(in_stack_000001c0,in_stack_000001b8,in_stack_000001b4);
  in_RDI[1] = pvVar2;
  in_RDI[2] = 0;
  this_00 = (TiledRgbaInputFile *)(in_RDI + 3);
  TiledInputFile::header((TiledInputFile *)in_RDI[1]);
  anon_unknown_22::prefixFromLayerName(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  RVar1 = channels(this_00);
  if ((RVar1 & WRITE_Y) != 0) {
    pvVar2 = operator_new(0x78);
    FromYa::FromYa((FromYa *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                   (TiledInputFile *)in_stack_ffffffffffffffd8);
    in_RDI[2] = pvVar2;
  }
  return;
}

Assistant:

TiledRgbaInputFile::TiledRgbaInputFile (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is,
					const string &layerName,
					int numThreads)
:
    _inputFile (new TiledInputFile (is, numThreads)),
    _fromYa (0),
    _channelNamePrefix (prefixFromLayerName (layerName, _inputFile->header()))
{
    if (channels() & WRITE_Y)
	_fromYa = new FromYa (*_inputFile);
}